

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdAddMultisigScriptSigData
              (void *handle,void *multisig_handle,char *signature,char *related_pubkey)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_61;
  string sig_str;
  ByteData signature_bytes;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&sig_str,"MultiScriptSig",(allocator *)&signature_bytes);
  cfd::capi::CheckBuffer(multisig_handle,&sig_str);
  std::__cxx11::string::~string((string *)&sig_str);
  if (signature == (char *)0x0) {
    sig_str._M_dataplus._M_p = "cfdcapi_script.cpp";
    sig_str._M_string_length._0_4_ = 0x12e;
    sig_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_74a733;
    cfd::core::logger::warn<>((CfdSourceLocation *)&sig_str,"signature is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sig_str,"Failed to parameter. signature is null.",
               (allocator *)&signature_bytes);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&sig_str);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(uint *)((long)multisig_handle + 0x15c8) < 0x14) {
    bVar1 = cfd::capi::IsEmptyString(signature);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&sig_str,signature,&local_61);
      cfd::core::ByteData::ByteData(&signature_bytes,&sig_str);
      std::__cxx11::string::~string((string *)&sig_str);
      cfd::core::ByteData::GetHex_abi_cxx11_(&sig_str,&signature_bytes);
      std::__cxx11::string::copy
                ((char *)&sig_str,
                 (long)multisig_handle +
                 (ulong)*(uint *)((long)multisig_handle + 0x15c8) * 0x93 + 0x10,0x92);
      std::__cxx11::string::~string((string *)&sig_str);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_bytes);
    }
    bVar1 = cfd::capi::IsEmptyString(related_pubkey);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&sig_str,related_pubkey,&local_61);
      cfd::core::Pubkey::Pubkey((Pubkey *)&signature_bytes,&sig_str);
      std::__cxx11::string::~string((string *)&sig_str);
      cfd::core::Pubkey::GetHex_abi_cxx11_(&sig_str,(Pubkey *)&signature_bytes);
      std::__cxx11::string::copy
                ((char *)&sig_str,
                 (long)multisig_handle +
                 (ulong)*(uint *)((long)multisig_handle + 0x15c8) * 0x83 + 0xb8c,0x82);
      std::__cxx11::string::~string((string *)&sig_str);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_bytes);
    }
    *(int *)((long)multisig_handle + 0x15c8) = *(int *)((long)multisig_handle + 0x15c8) + 1;
    return 0;
  }
  sig_str._M_dataplus._M_p = "cfdcapi_script.cpp";
  sig_str._M_string_length._0_4_ = 0x138;
  sig_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_74a733;
  cfd::core::logger::warn<>
            ((CfdSourceLocation *)&sig_str,"The number of signature has reached the upper limit.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sig_str,"The number of signature has reached the upper limit.",
             (allocator *)&signature_bytes);
  cfd::core::CfdException::CfdException(pCVar2,kCfdOutOfRangeError,&sig_str);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigScriptSigData(
    void* handle, void* multisig_handle, const char* signature,
    const char* related_pubkey) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScriptSig);
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    CfdCapiMultisigScriptSigData* data =
        static_cast<CfdCapiMultisigScriptSigData*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE,
          "The number of signature has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of signature has reached the upper limit.");
    }

    if (!IsEmptyString(signature)) {
      ByteData signature_bytes = ByteData(std::string(signature));
      std::string sig_str = signature_bytes.GetHex();
      sig_str.copy(data->signatures[data->current_index], kSignatureHexSize);
    }

    if (!IsEmptyString(related_pubkey)) {
      Pubkey key = Pubkey(std::string(related_pubkey));
      std::string pubkey_str = key.GetHex();
      pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    }

    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}